

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

bool __thiscall clipp::param_filter::operator()(param_filter *this,parameter *p)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  
  if (((((this->prefix_)._M_string_length == 0) ||
       (pbVar1 = (p->flags_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
       _Var2 = std::operator()((p->flags_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,pbVar1,this),
       _Var2._M_current != pbVar1)) && ((p->required_ ^ this->required_) != yes)) &&
     ((((p->super_token<clipp::parameter>).blocking_ ^ this->blocking_) != yes &&
      (((p->super_token<clipp::parameter>).repeatable_ ^ this->repeatable_) != yes)))) {
    return (bool)this->hasDoc_ != ((p->super_token<clipp::parameter>).doc_._M_string_length == 0);
  }
  return false;
}

Assistant:

bool operator() (const parameter& p) const noexcept {
        if(!prefix_.empty()) {
            if(!std::any_of(p.flags().begin(), p.flags().end(),
                [&](const arg_string& flag){
                    return str::has_prefix(flag, prefix_);
                })) return false;
        }
        if(required()   != p.required())     return false;
        if(blocking()   != p.blocking())     return false;
        if(repeatable() != p.repeatable())   return false;
        if(has_doc()    != !p.doc().empty()) return false;
        return true;
    }